

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O1

void __thiscall
string_assertion_test::iu_StrTest_x_iutest_x_NeString_Test<char16_t>::Body
          (iu_StrTest_x_iutest_x_NeString_Test<char16_t> *this)

{
  short *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  AssertionResult iutest_ar;
  String Test;
  String test;
  type **in_stack_fffffffffffffc28;
  AssertionResult local_3d0;
  AssertionHelper local_3a8;
  long *local_378;
  long local_370;
  long local_368 [2];
  long *local_358;
  long local_350;
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_2f8;
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_278;
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [392];
  
  puVar5 = (undefined *)0x2;
  puVar4 = (undefined *)0x2;
  if (text<char16_t>::test != (undefined *)0x0) {
    puVar3 = text<char16_t>::test + -2;
    do {
      puVar4 = puVar3 + 2;
      psVar1 = (short *)(puVar3 + 2);
      puVar3 = puVar4;
    } while (*psVar1 != 0);
  }
  local_358 = local_348;
  std::__cxx11::u16string::_M_construct<char16_t_const*>
            ((u16string *)&local_358,text<char16_t>::test,puVar4);
  if (text<char16_t>::Test != (undefined *)0x0) {
    puVar4 = text<char16_t>::Test + -2;
    do {
      puVar5 = puVar4 + 2;
      psVar1 = (short *)(puVar4 + 2);
      puVar4 = puVar5;
    } while (*psVar1 != 0);
  }
  local_378 = local_368;
  std::__cxx11::u16string::_M_construct<char16_t_const*>
            ((u16string *)&local_378,text<char16_t>::Test,puVar5);
  local_1d8[0] = local_1c8;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_1d8,local_358,(long)local_358 + local_350 * 2);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)&local_1f8,local_378,(long)local_378 + local_370 * 2);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            (&local_3d0,(internal *)0x3313c1,"Test",(char *)local_1d8,&local_1f8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] * 2 + 2);
  }
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc2f);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x87;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  paVar2 = &local_3d0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  puVar4 = text<char16_t>::test;
  local_218[0] = local_208;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_218,local_378,(long)local_378 + local_370 * 2);
  iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
            (&local_3d0,(internal *)"TestFixture::Text::test","Test",puVar4,(char16_t *)local_218,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc28);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] * 2 + 2);
  }
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc2f);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x88;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_238[0] = local_228;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_238,local_358,(long)local_358 + local_350 * 2);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
            (&local_3d0,(internal *)0x3313c1,"TestFixture::Text::Test",(char *)local_238,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffc28);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] * 2 + 2);
  }
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc2f);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x89;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_258[0] = local_248;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_258,local_358,(long)local_358 + local_350 * 2);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)&local_278,local_378,(long)local_378 + local_370 * 2);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            (&local_3d0,(internal *)0x3313c1,"Test",(char *)local_258,&local_278,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] * 2 + 2);
  }
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc2f);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x8b;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  puVar4 = text<char16_t>::test;
  local_298[0] = local_288;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_298,local_378,(long)local_378 + local_370 * 2);
  iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
            (&local_3d0,(internal *)"TestFixture::Text::test","Test",puVar4,(char16_t *)local_298,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc28);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] * 2 + 2);
  }
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc2f);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x8c;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2b8[0] = local_2a8;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_2b8,local_358,(long)local_358 + local_350 * 2);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
            (&local_3d0,(internal *)0x3313c1,"TestFixture::Text::Test",(char *)local_2b8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffc28);
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] * 2 + 2);
  }
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc2f);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x8d;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_2d8[0] = local_2c8;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_2d8,local_358,(long)local_358 + local_350 * 2);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)&local_2f8,local_378,(long)local_378 + local_370 * 2);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,std::__cxx11::u16string>
            (&local_3d0,(internal *)0x3313c1,"Test",(char *)local_2d8,&local_2f8,
             (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity * 2 + 2);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] * 2 + 2);
  }
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc2f);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x8f;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_3d0.m_message._M_dataplus._M_p,
                      local_3d0.m_message.field_2._M_allocated_capacity + 1);
    }
    puVar4 = text<char16_t>::test;
    local_318[0] = local_308;
    std::__cxx11::u16string::_M_construct<char16_t*>
              ((u16string *)local_318,local_378,(long)local_378 + local_370 * 2);
    iutest::internal::CmpHelperSTRNE<char16_t_const*,std::__cxx11::u16string>
              (&local_3d0,(internal *)"TestFixture::Text::test","Test",puVar4,(char16_t *)local_318,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffc28);
    if (local_318[0] != local_308) {
      operator_delete(local_318[0],local_308[0] * 2 + 2);
    }
    if (local_3d0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc2f);
      local_3a8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x90;
      local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
        operator_delete(local_3d0.m_message._M_dataplus._M_p,
                        local_3d0.m_message.field_2._M_allocated_capacity + 1);
      }
      local_338[0] = local_328;
      std::__cxx11::u16string::_M_construct<char16_t*>
                ((u16string *)local_338,local_358,(long)local_358 + local_350 * 2);
      iutest::internal::CmpHelperSTRNE<std::__cxx11::u16string,char16_t_const*>
                (&local_3d0,(internal *)0x3313c1,"TestFixture::Text::Test",(char *)local_338,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 text<char16_t>::Test,(char16_t *)&iutest_type_traits::enabler_t<void>::value,
                 in_stack_fffffffffffffc28);
      if (local_338[0] != local_328) {
        operator_delete(local_338[0],local_328[0] * 2 + 2);
      }
      if (local_3d0.m_result != false) goto LAB_002d962c;
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,local_3d0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc2f);
      local_3a8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x91;
      local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
LAB_002d962c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] * 2 + 2);
  }
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] * 2 + 2);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String Test = TestFixture::Text::Test;
    IUTEST_INFORM_STRNE(test, Test);
    IUTEST_INFORM_STRNE(TestFixture::Text::test, Test);
    IUTEST_INFORM_STRNE(test, TestFixture::Text::Test);

    IUTEST_EXPECT_STRNE(test, Test);
    IUTEST_EXPECT_STRNE(TestFixture::Text::test, Test);
    IUTEST_EXPECT_STRNE(test, TestFixture::Text::Test);

    IUTEST_ASSERT_STRNE(test, Test);
    IUTEST_ASSERT_STRNE(TestFixture::Text::test, Test);
    IUTEST_ASSERT_STRNE(test, TestFixture::Text::Test);
}